

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackGenerator.cxx
# Opt level: O2

int __thiscall
cmCPackGenerator::InstallProjectViaInstallCMakeProjects
          (cmCPackGenerator *this,bool setDestDir,string *baseTempInstallDirectory,
          mode_t *default_dir_mode)

{
  cmCPackLog *pcVar1;
  pointer pbVar2;
  size_type sVar3;
  pointer pbVar4;
  bool bVar5;
  int iVar6;
  cmValue cVar7;
  cmValue cVar8;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __first;
  cmake *gname;
  ostream *poVar9;
  pointer pbVar10;
  string *installType;
  _Alloc_hider _Var11;
  pointer pbVar12;
  pointer pbVar13;
  undefined8 uVar14;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  buildConfigs;
  undefined1 local_340 [8];
  string componentsVar;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  componentsVector;
  cmCPackInstallCMakeProject project;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  cmakeProjectsVector;
  string absoluteDestFiles;
  string installProjectName;
  string installDirectory;
  ostringstream cmCPackLog_msg;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&cmCPackLog_msg,"CPACK_INSTALL_CMAKE_PROJECTS",(allocator<char> *)&project);
  cVar7 = GetOption(this,(string *)&cmCPackLog_msg);
  std::__cxx11::string::~string((string *)&cmCPackLog_msg);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&cmCPackLog_msg,"CPACK_CMAKE_GENERATOR",(allocator<char> *)&project);
  cVar8 = GetOption(this,(string *)&cmCPackLog_msg);
  std::__cxx11::string::~string((string *)&cmCPackLog_msg);
  absoluteDestFiles._M_dataplus._M_p = (pointer)&absoluteDestFiles.field_2;
  absoluteDestFiles._M_string_length = 0;
  absoluteDestFiles.field_2._M_local_buf[0] = '\0';
  if ((cVar7.Value == (string *)0x0) || ((cVar7.Value)->_M_string_length == 0)) {
LAB_00157818:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&cmCPackLog_msg,"CPACK_ABSOLUTE_DESTINATION_FILES",
               (allocator<char> *)&project);
    StoreOption<cmValue>(this,(string *)&cmCPackLog_msg,&absoluteDestFiles);
    iVar6 = 1;
    std::__cxx11::string::~string((string *)&cmCPackLog_msg);
  }
  else {
    if (cVar8.Value == (string *)0x0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg);
      poVar9 = std::operator<<((ostream *)&cmCPackLog_msg,
                               "CPACK_INSTALL_CMAKE_PROJECTS is specified, but CPACK_CMAKE_GENERATOR is not. CPACK_CMAKE_GENERATOR is required to install the project."
                              );
      std::endl<char,std::char_traits<char>>(poVar9);
      pcVar1 = this->Logger;
      std::__cxx11::stringbuf::str();
      cmCPackLog::Log(pcVar1,0x10,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                      ,0x225,project.Directory._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)&project);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCPackLog_msg);
    }
    else {
      cmExpandedList_abi_cxx11_(&cmakeProjectsVector,cVar7,false);
      pbVar10 = cmakeProjectsVector.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      do {
        if (pbVar10 ==
            cmakeProjectsVector.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&cmakeProjectsVector);
          goto LAB_00157818;
        }
        if (((pbVar10 + 1 ==
              cmakeProjectsVector.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish) ||
            (pbVar10 + 2 ==
             cmakeProjectsVector.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish)) ||
           (pbVar10 + 3 ==
            cmakeProjectsVector.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish)) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg);
          poVar9 = std::operator<<((ostream *)&cmCPackLog_msg,
                                   "Not enough items on list: CPACK_INSTALL_CMAKE_PROJECTS. CPACK_INSTALL_CMAKE_PROJECTS should hold quadruplet of install directory, install project name, install component, and install subdirectory."
                                  );
          std::endl<char,std::char_traits<char>>(poVar9);
          pcVar1 = this->Logger;
          std::__cxx11::stringbuf::str();
          cmCPackLog::Log(pcVar1,0x10,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                          ,0x236,project.Directory._M_dataplus._M_p);
          std::__cxx11::string::~string((string *)&project);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCPackLog_msg);
          break;
        }
        std::__cxx11::string::string((string *)&installDirectory,(string *)pbVar10);
        std::__cxx11::string::string((string *)&installProjectName,(string *)(pbVar10 + 1));
        project.Directory._M_dataplus._M_p = (pointer)&project.Directory.field_2;
        project.Directory._M_string_length = 0;
        project.Directory.field_2._M_local_buf[0] = '\0';
        project.ProjectName._M_dataplus._M_p = (pointer)&project.ProjectName.field_2;
        project.ProjectName._M_string_length = 0;
        project.ProjectName.field_2._M_local_buf[0] = '\0';
        project.Component._M_dataplus._M_p = (pointer)&project.Component.field_2;
        project.Component._M_string_length = 0;
        project.Component.field_2._M_local_buf[0] = '\0';
        project.SubDirectory._M_dataplus._M_p = (pointer)&project.SubDirectory.field_2;
        project.SubDirectory._M_string_length = 0;
        project.SubDirectory.field_2._M_local_buf[0] = '\0';
        project.Components.
        super__Vector_base<cmCPackComponent_*,_std::allocator<cmCPackComponent_*>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        project.Components.
        super__Vector_base<cmCPackComponent_*,_std::allocator<cmCPackComponent_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        project.InstallationTypes.
        super__Vector_base<cmCPackInstallationType_*,_std::allocator<cmCPackInstallationType_*>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        project.Components.
        super__Vector_base<cmCPackComponent_*,_std::allocator<cmCPackComponent_*>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        project.InstallationTypes.
        super__Vector_base<cmCPackInstallationType_*,_std::allocator<cmCPackInstallationType_*>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        project.InstallationTypes.
        super__Vector_base<cmCPackInstallationType_*,_std::allocator<cmCPackInstallationType_*>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        std::__cxx11::string::_M_assign((string *)&project);
        std::__cxx11::string::_M_assign((string *)&project.ProjectName);
        std::__cxx11::string::_M_assign((string *)&project.Component);
        std::__cxx11::string::_M_assign((string *)&project.SubDirectory);
        componentsVector.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        componentsVector.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        componentsVector.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        iVar6 = (*this->_vptr_cmCPackGenerator[0x18])(this);
        if ((char)iVar6 == '\0') {
LAB_001572f8:
          uVar14 = 0;
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&cmCPackLog_msg,"CPACK_MONOLITHIC_INSTALL",
                     (allocator<char> *)&componentsVar);
          bVar5 = IsOn(this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &cmCPackLog_msg);
          std::__cxx11::string::~string((string *)&cmCPackLog_msg);
          if (bVar5) goto LAB_001572f8;
          cmsys::SystemTools::UpperCase((string *)&buildConfigs,&project.Component);
          std::operator+(&componentsVar,"CPACK_",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &buildConfigs);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &cmCPackLog_msg,&componentsVar,"_INSTALL_TYPES");
          std::__cxx11::string::~string((string *)&componentsVar);
          std::__cxx11::string::~string((string *)&buildConfigs);
          cVar7 = GetOption(this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&cmCPackLog_msg);
          if ((cVar7.Value != (string *)0x0) && ((cVar7.Value)->_M_string_length != 0)) {
            cmExpandedList_abi_cxx11_
                      ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&componentsVar,cVar7,false);
            sVar3 = componentsVar._M_string_length;
            for (_Var11 = componentsVar._M_dataplus; _Var11._M_p != (pointer)sVar3;
                _Var11._M_p = _Var11._M_p + 0x20) {
              iVar6 = (*this->_vptr_cmCPackGenerator[0x1a])(this,&project.ProjectName,_Var11._M_p);
              buildConfigs.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)CONCAT44(extraout_var,iVar6);
              std::vector<cmCPackInstallationType*,std::allocator<cmCPackInstallationType*>>::
              emplace_back<cmCPackInstallationType*>
                        ((vector<cmCPackInstallationType*,std::allocator<cmCPackInstallationType*>>
                          *)&project.InstallationTypes,(cmCPackInstallationType **)&buildConfigs);
            }
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&componentsVar);
          }
          cmsys::SystemTools::UpperCase((string *)&buildConfigs,&project.Component);
          std::operator+(&componentsVar,"CPACK_COMPONENTS_",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &buildConfigs);
          std::__cxx11::string::~string((string *)&buildConfigs);
          cVar7 = GetOption(this,&componentsVar);
          if ((cVar7.Value == (string *)0x0) || ((cVar7.Value)->_M_string_length == 0)) {
            uVar14 = 0;
          }
          else {
            cmExpandList(cVar7,&componentsVector,false);
            pbVar2 = componentsVector.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            for (pbVar12 = componentsVector.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start; pbVar12 != pbVar2;
                pbVar12 = pbVar12 + 1) {
              iVar6 = (*this->_vptr_cmCPackGenerator[0x1b])(this,&project.ProjectName,pbVar12);
              buildConfigs.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)CONCAT44(extraout_var_00,iVar6);
              std::vector<cmCPackComponent*,std::allocator<cmCPackComponent*>>::
              emplace_back<cmCPackComponent*>
                        ((vector<cmCPackComponent*,std::allocator<cmCPackComponent*>> *)
                         &project.Components,(cmCPackComponent **)&buildConfigs);
            }
            uVar14 = 1;
          }
          std::__cxx11::string::~string((string *)&componentsVar);
          std::__cxx11::string::~string((string *)&cmCPackLog_msg);
        }
        if (componentsVector.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start ==
            componentsVector.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&componentsVector,&project.Component);
        }
        buildConfigs.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        buildConfigs.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        buildConfigs.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&cmCPackLog_msg,"CPACK_BUILD_CONFIG",(allocator<char> *)&componentsVar)
        ;
        cVar7 = GetOption(this,(string *)&cmCPackLog_msg);
        cmExpandList(cVar7,&buildConfigs,false);
        std::__cxx11::string::~string((string *)&cmCPackLog_msg);
        std::
        __sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_less_iter>
                  (buildConfigs.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start,
                   buildConfigs.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish);
        __first = std::
                  __unique<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equal_to_iter>
                            (buildConfigs.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start,
                             buildConfigs.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::erase(&buildConfigs,(const_iterator)__first._M_current,
                (const_iterator)
                buildConfigs.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish);
        if (buildConfigs.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start ==
            buildConfigs.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::emplace_back<>(&buildConfigs);
        }
        gname = cmMakefile::GetCMakeInstance(this->MakefileMap);
        cmake::CreateGlobalGenerator((cmake *)local_340,(string *)gname,SUB81(cVar8.Value,0));
        pbVar2 = buildConfigs.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (local_340 == (undefined1  [8])0x0) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg);
          poVar9 = std::operator<<((ostream *)&cmCPackLog_msg,
                                   "Specified package generator not found. CPACK_CMAKE_GENERATOR value is invalid."
                                  );
          std::endl<char,std::char_traits<char>>(poVar9);
          pcVar1 = this->Logger;
          std::__cxx11::stringbuf::str();
          cmCPackLog::Log(pcVar1,0x10,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                          ,0x284,componentsVar._M_dataplus._M_p);
          std::__cxx11::string::~string((string *)&componentsVar);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCPackLog_msg);
LAB_00157717:
          bVar5 = false;
        }
        else {
          cmSystemTools::s_ForceUnixPaths =
               *(bool *)((long)&(((pointer)((long)local_340 + 0x6e0))->_M_t).
                                super___uniq_ptr_impl<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_cmGlobalGeneratorFactory_*,_std::default_delete<cmGlobalGeneratorFactory>_>
                                .super__Head_base<0UL,_cmGlobalGeneratorFactory_*,_false>.
                                _M_head_impl + 6);
          for (pbVar12 = buildConfigs.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start; pbVar12 != pbVar2;
              pbVar12 = pbVar12 + 1) {
            iVar6 = (*this->_vptr_cmCPackGenerator[0x14])
                              (this,&project.ProjectName,&project,local_340,pbVar12);
            if (iVar6 == 0) goto LAB_00157717;
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg);
            poVar9 = std::operator<<((ostream *)&cmCPackLog_msg,"- Install project: ");
            poVar9 = std::operator<<(poVar9,(string *)&project.ProjectName);
            poVar9 = std::operator<<(poVar9," [");
            poVar9 = std::operator<<(poVar9,(string *)pbVar12);
            poVar9 = std::operator<<(poVar9,']');
            std::endl<char,std::char_traits<char>>(poVar9);
            pcVar1 = this->Logger;
            std::__cxx11::stringbuf::str();
            cmCPackLog::Log(pcVar1,1,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                            ,0x296,componentsVar._M_dataplus._M_p);
            std::__cxx11::string::~string((string *)&componentsVar);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCPackLog_msg);
            pbVar4 = componentsVector.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            pbVar13 = componentsVector.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            while (pbVar13 != pbVar4) {
              iVar6 = (*this->_vptr_cmCPackGenerator[0x15])
                                (this,(ulong)setDestDir,&project,baseTempInstallDirectory,
                                 default_dir_mode,pbVar13,uVar14,&project.SubDirectory,pbVar12,
                                 &absoluteDestFiles);
              pbVar13 = pbVar13 + 1;
              if (iVar6 == 0) goto LAB_00157717;
            }
          }
          bVar5 = true;
          std::vector<cmCPackInstallCMakeProject,_std::allocator<cmCPackInstallCMakeProject>_>::
          emplace_back<cmCPackInstallCMakeProject>(&this->CMakeProjects,&project);
        }
        if (local_340 != (undefined1  [8])0x0) {
          (*(code *)(((__uniq_ptr_data<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>,_true,_true>
                       *)local_340)->
                    super___uniq_ptr_impl<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>
                    )._M_t.
                    super__Tuple_impl<0UL,_cmGlobalGeneratorFactory_*,_std::default_delete<cmGlobalGeneratorFactory>_>
                    .super__Head_base<0UL,_cmGlobalGeneratorFactory_*,_false>._M_head_impl[1].
                    _vptr_cmGlobalGeneratorFactory)();
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&buildConfigs);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&componentsVector);
        cmCPackInstallCMakeProject::~cmCPackInstallCMakeProject(&project);
        std::__cxx11::string::~string((string *)&installProjectName);
        std::__cxx11::string::~string((string *)&installDirectory);
        pbVar10 = pbVar10 + 4;
      } while (bVar5);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&cmakeProjectsVector);
    }
    iVar6 = 0;
  }
  std::__cxx11::string::~string((string *)&absoluteDestFiles);
  return iVar6;
}

Assistant:

int cmCPackGenerator::InstallProjectViaInstallCMakeProjects(
  bool setDestDir, const std::string& baseTempInstallDirectory,
  const mode_t* default_dir_mode)
{
  cmValue cmakeProjects = this->GetOption("CPACK_INSTALL_CMAKE_PROJECTS");
  cmValue cmakeGenerator = this->GetOption("CPACK_CMAKE_GENERATOR");
  std::string absoluteDestFiles;
  if (cmNonempty(cmakeProjects)) {
    if (!cmakeGenerator) {
      cmCPackLogger(cmCPackLog::LOG_ERROR,
                    "CPACK_INSTALL_CMAKE_PROJECTS is specified, but "
                    "CPACK_CMAKE_GENERATOR is not. CPACK_CMAKE_GENERATOR "
                    "is required to install the project."
                      << std::endl);
      return 0;
    }
    std::vector<std::string> cmakeProjectsVector =
      cmExpandedList(cmakeProjects);
    std::vector<std::string>::iterator it;
    for (it = cmakeProjectsVector.begin(); it != cmakeProjectsVector.end();
         ++it) {
      if (it + 1 == cmakeProjectsVector.end() ||
          it + 2 == cmakeProjectsVector.end() ||
          it + 3 == cmakeProjectsVector.end()) {
        cmCPackLogger(
          cmCPackLog::LOG_ERROR,
          "Not enough items on list: CPACK_INSTALL_CMAKE_PROJECTS. "
          "CPACK_INSTALL_CMAKE_PROJECTS should hold quadruplet of install "
          "directory, install project name, install component, and install "
          "subdirectory."
            << std::endl);
        return 0;
      }
      std::string installDirectory = *it;
      ++it;
      std::string installProjectName = *it;
      ++it;
      cmCPackInstallCMakeProject project;

      project.Directory = installDirectory;
      project.ProjectName = installProjectName;
      project.Component = *it;
      ++it;
      project.SubDirectory = *it;

      std::vector<std::string> componentsVector;

      bool componentInstall = false;
      /*
       * We do a component install iff
       *    - the CPack generator support component
       *    - the user did not request Monolithic install
       *      (this works at CPack time too)
       */
      if (this->SupportsComponentInstallation() &&
          !(this->IsOn("CPACK_MONOLITHIC_INSTALL"))) {
        // Determine the installation types for this project (if provided).
        std::string installTypesVar = "CPACK_" +
          cmSystemTools::UpperCase(project.Component) + "_INSTALL_TYPES";
        cmValue installTypes = this->GetOption(installTypesVar);
        if (cmNonempty(installTypes)) {
          std::vector<std::string> installTypesVector =
            cmExpandedList(installTypes);
          for (std::string const& installType : installTypesVector) {
            project.InstallationTypes.push_back(
              this->GetInstallationType(project.ProjectName, installType));
          }
        }

        // Determine the set of components that will be used in this project
        std::string componentsVar =
          "CPACK_COMPONENTS_" + cmSystemTools::UpperCase(project.Component);
        cmValue components = this->GetOption(componentsVar);
        if (cmNonempty(components)) {
          cmExpandList(components, componentsVector);
          for (std::string const& comp : componentsVector) {
            project.Components.push_back(
              this->GetComponent(project.ProjectName, comp));
          }
          componentInstall = true;
        }
      }
      if (componentsVector.empty()) {
        componentsVector.push_back(project.Component);
      }

      std::vector<std::string> buildConfigs;

      // Try get configuration names given via `-C` CLI option
      cmExpandList(this->GetOption("CPACK_BUILD_CONFIG"), buildConfigs);

      // Remove duplicates
      std::sort(buildConfigs.begin(), buildConfigs.end());
      buildConfigs.erase(std::unique(buildConfigs.begin(), buildConfigs.end()),
                         buildConfigs.end());

      // Ensure we have at least one configuration.
      if (buildConfigs.empty()) {
        buildConfigs.emplace_back();
      }

      std::unique_ptr<cmGlobalGenerator> globalGenerator =
        this->MakefileMap->GetCMakeInstance()->CreateGlobalGenerator(
          cmakeGenerator);
      if (!globalGenerator) {
        cmCPackLogger(cmCPackLog::LOG_ERROR,
                      "Specified package generator not found. "
                      "CPACK_CMAKE_GENERATOR value is invalid."
                        << std::endl);
        return 0;
      }
      // set the global flag for unix style paths on cmSystemTools as
      // soon as the generator is set.  This allows gmake to be used
      // on windows.
      cmSystemTools::SetForceUnixPaths(globalGenerator->GetForceUnixPaths());

      // Run the installation for the selected build configurations
      for (auto const& buildConfig : buildConfigs) {
        if (!this->RunPreinstallTarget(project.ProjectName, project.Directory,
                                       globalGenerator.get(), buildConfig)) {
          return 0;
        }

        cmCPackLogger(cmCPackLog::LOG_OUTPUT,
                      "- Install project: " << project.ProjectName << " ["
                                            << buildConfig << ']'
                                            << std::endl);
        // Run the installation for each component
        for (std::string const& component : componentsVector) {
          if (!this->InstallCMakeProject(
                setDestDir, project.Directory, baseTempInstallDirectory,
                default_dir_mode, component, componentInstall,
                project.SubDirectory, buildConfig, absoluteDestFiles)) {
            return 0;
          }
        }
      }

      this->CMakeProjects.emplace_back(std::move(project));
    }
  }
  this->SetOption("CPACK_ABSOLUTE_DESTINATION_FILES", absoluteDestFiles);
  return 1;
}